

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall QCalendarWidgetPrivate::update(QCalendarWidgetPrivate *this)

{
  long *plVar1;
  int *in_RDI;
  long in_FS_OFFSET;
  QModelIndex idx;
  int column;
  int row;
  QDate currentDate;
  long *plVar2;
  int iVar3;
  int iVar4;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined1 local_68 [24];
  undefined1 *local_50;
  QDate in_stack_ffffffffffffffb8;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined8 local_20;
  int local_18;
  int local_14;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = *(undefined8 *)(*(long *)(in_RDI + 0x96) + 0x20);
  local_14 = -0x55555556;
  local_18 = -0x55555556;
  local_10 = local_20;
  QtPrivate::QCalendarModel::cellForDate
            ((QCalendarModel *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffffb8,in_RDI,in_RDI);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::QModelIndex((QModelIndex *)0x51d6ef);
  (**(code **)(**(long **)(in_RDI + 0x9c) + 0x78))();
  if ((local_14 != -1) && (local_18 != -1)) {
    plVar2 = *(long **)(in_RDI + 0x96);
    iVar3 = local_14;
    iVar4 = local_18;
    QModelIndex::QModelIndex((QModelIndex *)0x51d74d);
    (**(code **)(*plVar2 + 0x60))(&local_50,plVar2,iVar3,iVar4,local_68);
    local_38 = local_50;
    local_28 = local_40;
    plVar1 = *(long **)(in_RDI + 0x9c);
    local_30 = (undefined1 *)in_stack_ffffffffffffffb8.jd;
    QFlags<QItemSelectionModel::SelectionFlag>::QFlags
              ((QFlags<QItemSelectionModel::SelectionFlag> *)CONCAT44(iVar4,iVar3),
               (SelectionFlag)((ulong)plVar2 >> 0x20));
    (**(code **)(*plVar1 + 0x60))(plVar1,&local_38,in_stack_ffffffffffffff94);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarWidgetPrivate::update()
{
    QDate currentDate = m_model->m_date;
    int row, column;
    m_model->cellForDate(currentDate, &row, &column);
    QModelIndex idx;
    m_selection->clear();
    if (row != -1 && column != -1) {
        idx = m_model->index(row, column);
        m_selection->setCurrentIndex(idx, QItemSelectionModel::SelectCurrent);
    }
}